

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void return_example(vw *all,example *ec)

{
  int **ppiVar1;
  long in_RSI;
  long *in_RDI;
  double dVar2;
  int f;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  float in_stack_00000160;
  bool in_stack_00000167;
  size_t in_stack_00000168;
  uint32_t in_stack_00000174;
  string *in_stack_00000178;
  size_t in_stack_00000180;
  bool in_stack_0000018f;
  shared_data *in_stack_00000190;
  v_array<char> *in_stack_000001d0;
  v_array<float> *in_stack_000001d8;
  int in_stack_000001e4;
  uint in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vw *in_stack_ffffffffffffff70;
  allocator local_51;
  string local_50 [36];
  int local_2c;
  int *local_28;
  int *local_20;
  v_array<int> *local_18;
  long *local_8;
  
  local_8 = in_RDI;
  shared_data::update((shared_data *)*in_RDI,(bool)(*(byte *)(in_RSI + 0x68c8) & 1),true,
                      *(float *)(in_RSI + 0x68b0),*(float *)(in_RSI + 0x6870),
                      *(size_t *)(in_RSI + 0x68a0));
  local_18 = (v_array<int> *)(local_8 + 0x6a2);
  ppiVar1 = v_array<int>::begin(local_18);
  local_20 = *ppiVar1;
  ppiVar1 = v_array<int>::end(local_18);
  local_28 = *ppiVar1;
  for (; local_20 != local_28; local_20 = local_20 + 1) {
    local_2c = *local_20;
    MWT::print_scalars(in_stack_000001e4,in_stack_000001d8,in_stack_000001d0);
  }
  dVar2 = shared_data::weighted_examples((shared_data *)*local_8);
  if (((double)*(float *)(*local_8 + 0x50) <= dVar2) &&
     ((*(byte *)((long)local_8 + 0x3439) & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"none",&local_51);
    in_stack_ffffffffffffff68 = *(byte *)((long)local_8 + 0x361a) & 1;
    shared_data::print_update
              (in_stack_00000190,in_stack_0000018f,in_stack_00000180,in_stack_00000178,
               in_stack_00000174,in_stack_00000168,in_stack_00000167,in_stack_00000160);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  VW::finish_example(in_stack_ffffffffffffff70,
                     (example *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  return;
}

Assistant:

void return_example(vw &all, example &ec)
{
  all.sd->update(ec.test_only, true, ec.loss, ec.weight, ec.num_features);
  for (int f : all.final_prediction_sink) MWT::print_scalars(f, ec.pred.scalars, ec.tag);

  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet)
    all.sd->print_update(
        all.holdout_set_off, all.current_pass, "none", 0, ec.num_features, all.progress_add, all.progress_arg);
  VW::finish_example(all, ec);
}